

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O3

llama_token
try_draft(common_ngram_cache *nc_primary,
         vector<common_ngram,_std::allocator<common_ngram>_> *ngrams_primary,
         common_ngram_cache_part *part_static,int *min_sample_size,int *min_percent)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  int iVar8;
  ulong uVar9;
  __node_base _Var10;
  int iVar11;
  int iVar12;
  llama_token token;
  common_ngram_cache_part part_primary;
  common_ngram ngram_primary;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_> local_b8
  ;
  int *local_b0;
  _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_a8;
  vector<common_ngram,_std::allocator<common_ngram>_> *local_a0;
  int *local_98;
  ulong local_90;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  key_type local_48;
  
  uVar3 = (int)((ulong)((long)(ngrams_primary->
                              super__Vector_base<common_ngram,_std::allocator<common_ngram>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ngrams_primary->
                             super__Vector_base<common_ngram,_std::allocator<common_ngram>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
  if ((int)uVar3 < 0) {
    iVar8 = -1;
  }
  else {
    uVar9 = (ulong)uVar3;
    local_b0 = min_percent;
    local_a8 = &nc_primary->_M_h;
    local_a0 = ngrams_primary;
    local_98 = min_sample_size;
    local_88 = &part_static->_M_h;
    do {
      pcVar1 = (ngrams_primary->super__Vector_base<common_ngram,_std::allocator<common_ngram>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar9;
      local_48.tokens._0_8_ = *(undefined8 *)pcVar1->tokens;
      local_48.tokens._8_8_ = *(undefined8 *)(pcVar1->tokens + 2);
      iVar6 = std::
              _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&nc_primary->_M_h,&local_48);
      iVar8 = -1;
      if (iVar6.
          super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        iVar11 = 0;
        local_80._M_buckets = (__buckets_ptr)0x0;
        local_80._M_bucket_count =
             *(size_type *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x20);
        local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_80._M_element_count =
             *(size_type *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x30);
        local_80._M_rehash_policy._0_8_ =
             *(undefined8 *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x38);
        local_80._M_rehash_policy._M_next_resize =
             *(size_t *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x40);
        local_80._M_single_bucket = (__node_base_ptr)0x0;
        local_b8._M_h = (__hashtable_alloc *)&local_80;
        std::
        _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                  ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_80,
                   (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)iVar6.
                             super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                             ._M_cur + 0x18),&local_b8);
        iVar12 = -1;
        iVar5 = 0;
        if (local_80._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          iVar5 = 0;
          iVar8 = 0;
          iVar11 = 0;
          _Var10._M_nxt = local_80._M_before_begin._M_nxt;
          local_90 = uVar9;
          do {
            iVar2 = *(int *)((long)&_Var10._M_nxt[1]._M_nxt + 4);
            local_b8._M_h._0_4_ = *(undefined4 *)&_Var10._M_nxt[1]._M_nxt;
            iVar7 = std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_88,(key_type *)&local_b8);
            if (iVar7.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
                (__node_type *)0x0) {
              iVar4 = 1;
            }
            else {
              iVar4 = *(int *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                     _M_cur + 0xc) * 100;
            }
            if (iVar5 * iVar8 < iVar4 * iVar2) {
              iVar5 = iVar2;
              iVar8 = iVar4;
              iVar12 = (int)local_b8._M_h;
            }
            iVar11 = iVar11 + iVar2;
            _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
          } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
          iVar5 = iVar5 * 100;
          ngrams_primary = local_a0;
          uVar9 = local_90;
          nc_primary = (common_ngram_cache *)local_a8;
        }
        iVar8 = -1;
        if ((local_98[uVar9] <= iVar11) && (iVar8 = iVar12, iVar5 < iVar11 * local_b0[uVar9])) {
          iVar8 = -1;
        }
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_80);
      }
    } while ((0 < (long)uVar9) && (uVar9 = uVar9 - 1, iVar8 == -1));
  }
  return iVar8;
}

Assistant:

static llama_token try_draft(
    common_ngram_cache & nc_primary, const std::vector<common_ngram> & ngrams_primary, common_ngram_cache_part & part_static,
    const int * min_sample_size, const int * min_percent) {

    llama_token drafted_token = LLAMA_TOKEN_NULL;

    for (int i = ngrams_primary.size()-1; i >= 0 && drafted_token == LLAMA_TOKEN_NULL; --i) {
        const common_ngram ngram_primary = ngrams_primary[i];

        common_ngram_cache::iterator part_primary_it = nc_primary.find(ngram_primary);
        if (part_primary_it == nc_primary.end()) {
            continue;
        }
        const common_ngram_cache_part part_primary = part_primary_it->second;

        int max_count_primary = 0;
        int max_count_static  = 0;
        int sum_count_primary = 0;
        llama_token max_token = LLAMA_TOKEN_NULL;

        for (std::pair<llama_token, int> token_count_primary : part_primary) {
            const llama_token token = token_count_primary.first;

            common_ngram_cache_part::iterator token_count_static_it = part_static.find(token);

            const int32_t count_primary = token_count_primary.second;
            const int32_t count_static  = token_count_static_it != part_static.end() ? 100*token_count_static_it->second : 1;

            if (count_primary*count_static > max_count_primary*max_count_static) {
                max_token         = token;
                max_count_primary = count_primary;
                max_count_static  = count_static;
            }
            sum_count_primary += count_primary;
        }

        if (sum_count_primary < min_sample_size[i]) {
            continue;
        }
        if (100*max_count_primary < min_percent[i]*sum_count_primary) {
            continue;;
        }
        drafted_token = max_token;
    }

    return drafted_token;
}